

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_create(REF_GATHER *ref_gather_ptr)

{
  REF_GATHER pRVar1;
  REF_GATHER ref_gather;
  REF_GATHER *ref_gather_ptr_local;
  
  pRVar1 = (REF_GATHER)malloc(0x30);
  *ref_gather_ptr = pRVar1;
  if (*ref_gather_ptr == (REF_GATHER)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x29,
           "ref_gather_create","malloc *ref_gather_ptr of REF_GATHER_STRUCT NULL");
    ref_gather_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_gather_ptr;
    pRVar1->recording = 0;
    pRVar1->grid_file = (FILE *)0x0;
    pRVar1->hist_file = (FILE *)0x0;
    pRVar1->time = 0.0;
    pRVar1->low_quality_zone = 0;
    pRVar1->min_quality = 0.1;
    ref_gather_ptr_local._4_4_ = 0;
  }
  return ref_gather_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_gather_create(REF_GATHER *ref_gather_ptr) {
  REF_GATHER ref_gather;

  ref_malloc(*ref_gather_ptr, 1, REF_GATHER_STRUCT);

  ref_gather = *ref_gather_ptr;

  ref_gather->recording = REF_FALSE;
  ref_gather->grid_file = (FILE *)NULL;
  ref_gather->hist_file = (FILE *)NULL;
  ref_gather->time = 0.0;

  ref_gather->low_quality_zone = REF_FALSE;
  ref_gather->min_quality = 0.1;

  return REF_SUCCESS;
}